

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtptngen.cpp
# Opt level: O3

void __thiscall
icu_63::DateTimePatternGenerator::AppendItemFormatsSink::put
          (AppendItemFormatsSink *this,char *key,ResourceValue *value,UBool param_3,
          UErrorCode *errorCode)

{
  char *__s2;
  char cVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined7 in_register_00000009;
  UnicodeString *this_00;
  int i;
  long lVar3;
  long lVar4;
  int32_t len;
  ResourceTable itemsTable;
  int32_t local_cc;
  char *local_c8;
  ConstChar16Ptr local_c0;
  AppendItemFormatsSink *local_b8;
  UErrorCode *local_b0;
  char16_t *local_a8;
  UnicodeString local_98;
  ResourceTable local_58;
  
  local_c8 = key;
  local_b8 = this;
  (*(value->super_UObject)._vptr_UObject[0xb])
            (&local_58,value,errorCode,CONCAT71(in_register_00000009,param_3));
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    i = 0;
    local_b0 = errorCode;
    cVar1 = ResourceTable::getKeyAndValue(&local_58,0,&local_c8,value);
    __s2 = local_c8;
    while (cVar1 != '\0') {
      lVar3 = -0x108;
      lVar4 = 0;
      local_c8 = __s2;
      do {
        iVar2 = strcmp(*(char **)((long)&CLDR_FIELD_APPEND + lVar4),__s2);
        if (iVar2 == 0) {
          if (lVar4 != 0x80) {
            local_cc = 0;
            iVar2 = (*(value->super_UObject)._vptr_UObject[4])(value,&local_cc,local_b0);
            local_c0.p_ = (char16_t *)CONCAT44(extraout_var,iVar2);
            icu_63::UnicodeString::UnicodeString(&local_98,'\x01',&local_c0,local_cc);
            local_a8 = local_c0.p_;
            if ((*(ushort *)(&local_b8->dtpg->field_0x110 + lVar4 * 8) < 0x20) &&
               (0x1f < (ushort)local_98.fUnion.fStackFields.fLengthAndFlags)) {
              this_00 = (UnicodeString *)((long)local_b8->dtpg - lVar3);
              icu_63::UnicodeString::operator=(this_00,&local_98);
              icu_63::UnicodeString::getTerminatedBuffer(this_00);
            }
            icu_63::UnicodeString::~UnicodeString(&local_98);
          }
          break;
        }
        lVar3 = lVar3 + -0x40;
        lVar4 = lVar4 + 8;
      } while (lVar4 != 0x80);
      i = i + 1;
      cVar1 = ResourceTable::getKeyAndValue(&local_58,i,&local_c8,value);
      __s2 = local_c8;
    }
  }
  return;
}

Assistant:

virtual void put(const char *key, ResourceValue &value, UBool /*noFallback*/,
            UErrorCode &errorCode) {
        ResourceTable itemsTable = value.getTable(errorCode);
        if (U_FAILURE(errorCode)) { return; }
        for (int32_t i = 0; itemsTable.getKeyAndValue(i, key, value); ++i) {
            UDateTimePatternField field = dtpg.getAppendFormatNumber(key);
            if (field == UDATPG_FIELD_COUNT) { continue; }
            const UnicodeString& valueStr = value.getUnicodeString(errorCode);
            if (dtpg.getAppendItemFormat(field).isEmpty() && !valueStr.isEmpty()) {
                dtpg.setAppendItemFormat(field, valueStr);
            }
        }
    }